

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O3

bool caffe::NetNeedsDataUpgrade(NetParameter *net_param)

{
  RepeatedPtrField<caffe::V1LayerParameter> *this;
  HasBits<1UL> HVar1;
  Type *pTVar2;
  int index;
  DataParameter *from;
  ImageDataParameter *from_00;
  WindowDataParameter *from_01;
  DataParameter layer_param;
  WindowDataParameter WStack_88;
  
  index = 0;
  if (0 < (net_param->layers_).super_RepeatedPtrFieldBase.current_size_) {
    this = &net_param->layers_;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,index);
      if (pTVar2->type_ == 5) {
        pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,index);
        from = pTVar2->data_param_;
        if (from == (DataParameter *)0x0) {
          from = (DataParameter *)&_DataParameter_default_instance_;
        }
        DataParameter::DataParameter((DataParameter *)&WStack_88,from);
        HVar1.has_bits_[0] = WStack_88._has_bits_.has_bits_[0];
        if (((uint)WStack_88._has_bits_.has_bits_[0] & 0x10a) == 0) {
          DataParameter::~DataParameter((DataParameter *)&WStack_88);
          if (((uint)HVar1.has_bits_[0] & 0x20) == 0) goto LAB_0042a57e;
        }
        else {
          DataParameter::~DataParameter((DataParameter *)&WStack_88);
        }
LAB_0042a64e:
        index = 1;
        goto LAB_0042a650;
      }
LAB_0042a57e:
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,index);
      if (pTVar2->type_ == 0xc) {
        pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,index);
        from_00 = pTVar2->image_data_param_;
        if (from_00 == (ImageDataParameter *)0x0) {
          from_00 = (ImageDataParameter *)&_ImageDataParameter_default_instance_;
        }
        ImageDataParameter::ImageDataParameter((ImageDataParameter *)&WStack_88,from_00);
        HVar1.has_bits_[0] = WStack_88._has_bits_.has_bits_[0];
        if (((uint)WStack_88._has_bits_.has_bits_[0] & 0x40a) == 0) {
          ImageDataParameter::~ImageDataParameter((ImageDataParameter *)&WStack_88);
          if (((uint)HVar1.has_bits_[0] & 0x40) == 0) goto LAB_0042a5d0;
        }
        else {
          ImageDataParameter::~ImageDataParameter((ImageDataParameter *)&WStack_88);
        }
        goto LAB_0042a64e;
      }
LAB_0042a5d0:
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,index);
      if (pTVar2->type_ == 0x18) {
        pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,index);
        from_01 = pTVar2->window_data_param_;
        if (from_01 == (WindowDataParameter *)0x0) {
          from_01 = (WindowDataParameter *)&_WindowDataParameter_default_instance_;
        }
        WindowDataParameter::WindowDataParameter(&WStack_88,from_01);
        HVar1.has_bits_[0] = WStack_88._has_bits_.has_bits_[0];
        if (((uint)WStack_88._has_bits_.has_bits_[0] & 0x222) == 0) {
          WindowDataParameter::~WindowDataParameter(&WStack_88);
          if (((uint)HVar1.has_bits_[0] & 0x40) == 0) goto LAB_0042a622;
        }
        else {
          WindowDataParameter::~WindowDataParameter(&WStack_88);
        }
        goto LAB_0042a64e;
      }
LAB_0042a622:
      index = index + 1;
    } while (index < (net_param->layers_).super_RepeatedPtrFieldBase.current_size_);
    index = 0;
  }
LAB_0042a650:
  return SUB41(index,0);
}

Assistant:

bool NetNeedsDataUpgrade(const NetParameter& net_param) {
  for (int i = 0; i < net_param.layers_size(); ++i) {
    if (net_param.layers(i).type() == V1LayerParameter_LayerType_DATA) {
      DataParameter layer_param = net_param.layers(i).data_param();
      if (layer_param.has_scale()) { return true; }
      if (layer_param.has_mean_file()) { return true; }
      if (layer_param.has_crop_size()) { return true; }
      if (layer_param.has_mirror()) { return true; }
    }
    if (net_param.layers(i).type() == V1LayerParameter_LayerType_IMAGE_DATA) {
      ImageDataParameter layer_param = net_param.layers(i).image_data_param();
      if (layer_param.has_scale()) { return true; }
      if (layer_param.has_mean_file()) { return true; }
      if (layer_param.has_crop_size()) { return true; }
      if (layer_param.has_mirror()) { return true; }
    }
    if (net_param.layers(i).type() == V1LayerParameter_LayerType_WINDOW_DATA) {
      WindowDataParameter layer_param = net_param.layers(i).window_data_param();
      if (layer_param.has_scale()) { return true; }
      if (layer_param.has_mean_file()) { return true; }
      if (layer_param.has_crop_size()) { return true; }
      if (layer_param.has_mirror()) { return true; }
    }
  }
  return false;
}